

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirementsForOpcode
          (TrimCapabilitiesPass *this,Op opcode,CapabilitySet *capabilities,ExtensionSet *extensions
          )

{
  bool bVar1;
  spv_result_t sVar2;
  IRContext *this_00;
  AssemblyGrammar *this_01;
  spv_opcode_desc_t *psStack_30;
  spv_result_t result;
  spv_opcode_desc_t *desc;
  ExtensionSet *extensions_local;
  CapabilitySet *capabilities_local;
  TrimCapabilitiesPass *pTStack_10;
  Op opcode_local;
  TrimCapabilitiesPass *this_local;
  
  desc = (spv_opcode_desc_t *)extensions;
  extensions_local = (ExtensionSet *)capabilities;
  capabilities_local._4_4_ = opcode;
  pTStack_10 = this;
  bVar1 = anon_unknown_0::hasOpcodeConflictingCapabilities(opcode);
  if (!bVar1) {
    psStack_30 = (spv_opcode_desc_t *)0x0;
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::grammar(this_00);
    sVar2 = AssemblyGrammar::lookupOpcode(this_01,capabilities_local._4_4_,&stack0xffffffffffffffd0)
    ;
    if (sVar2 == SPV_SUCCESS) {
      addSupportedCapabilitiesToSet<spv_opcode_desc_t>
                (this,psStack_30,(CapabilitySet *)extensions_local);
      addSupportedExtensionsToSet<spv_opcode_desc_t>(this,psStack_30,(ExtensionSet *)desc);
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirementsForOpcode(
    spv::Op opcode, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  if (hasOpcodeConflictingCapabilities(opcode)) {
    return;
  }

  const spv_opcode_desc_t* desc = {};
  auto result = context()->grammar().lookupOpcode(opcode, &desc);
  if (result != SPV_SUCCESS) {
    return;
  }

  addSupportedCapabilitiesToSet(desc, capabilities);
  addSupportedExtensionsToSet(desc, extensions);
}